

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialDistrFunc.cpp
# Opt level: O2

void __thiscall OpenMD::RadialDistrFunc::process(RadialDistrFunc *this)

{
  SelectionManager *this_00;
  SelectionManager *this_01;
  SelectionManager *this_02;
  int iVar1;
  int iVar2;
  int whichFrame;
  SelectionManager local_1350;
  DumpReader reader;
  
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])();
  DumpReader::DumpReader
            (&reader,(this->super_StaticAnalyser).info_,&(this->super_StaticAnalyser).dumpFilename_)
  ;
  iVar1 = DumpReader::getNFrames(&reader);
  this->nProcessed_ = iVar1 / (this->super_StaticAnalyser).step_;
  this_00 = &this->seleMan1_;
  this_01 = &this->seleMan2_;
  this_02 = &this->common_;
  for (whichFrame = 0; whichFrame < iVar1;
      whichFrame = whichFrame + (this->super_StaticAnalyser).step_) {
    DumpReader::readFrame(&reader,whichFrame);
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    if ((this->evaluator1_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_1350,&this->evaluator1_);
      SelectionManager::setSelectionSet(this_00,(SelectionSet *)&local_1350);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1350)
      ;
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xb])(this,this_00);
    }
    if ((this->evaluator2_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_1350,&this->evaluator2_);
      SelectionManager::setSelectionSet(this_01,(SelectionSet *)&local_1350);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1350)
      ;
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xc])(this,this_01);
    }
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[8])(this);
    if (((this->evaluator1_).isDynamic_ != false) || ((this->evaluator2_).isDynamic_ == true)) {
      operator&(&local_1350,this_00,this_01);
      SelectionManager::operator=(this_02,&local_1350);
      SelectionManager::~SelectionManager(&local_1350);
      operator-(&local_1350,this_00,this_02);
      SelectionManager::operator=(&this->sele1_minus_common_,&local_1350);
      SelectionManager::~SelectionManager(&local_1350);
      operator-(&local_1350,this_01,this_02);
      SelectionManager::operator=(&this->sele2_minus_common_,&local_1350);
      SelectionManager::~SelectionManager(&local_1350);
      iVar2 = SelectionManager::getSelectionCount(this_00);
      this->nSelected1_ = iVar2;
      iVar2 = SelectionManager::getSelectionCount(this_01);
      this->nSelected2_ = iVar2;
      iVar2 = SelectionManager::getSelectionCount(this_02);
      this->nPairs_ = ((iVar2 + 1) * iVar2) / -2 + this->nSelected2_ * this->nSelected1_;
    }
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[6])(this,&this->sele1_minus_common_,this_01)
    ;
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[6])(this,this_02,&this->sele2_minus_common_)
    ;
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[7])(this,this_02);
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[10])(this);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])(this);
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xd])(this);
  DumpReader::~DumpReader(&reader);
  return;
}

Assistant:

void RadialDistrFunc::process() {
    preProcess();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int i = 0; i < nFrames; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
        validateSelection1(seleMan1_);
      }
      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
        validateSelection2(seleMan2_);
      }

      initializeHistogram();

      // Selections may overlap, and we need a bit of logic to deal
      // with this.
      //
      // |     s1    |
      // | s1 -c | c |
      //         | c | s2 - c |
      //         |    s2      |
      //
      // s1 : Set of StuntDoubles in selection1
      // s2 : Set of StuntDoubles in selection2
      // c  : Intersection of selection1 and selection2
      //
      // When we loop over the pairs, we can divide the looping into 3
      // stages:
      //
      // Stage 1 :     [s1-c]      [s2]
      // Stage 2 :     [c]         [s2 - c]
      // Stage 3 :     [c]         [c]
      // Stages 1 and 2 are completely non-overlapping.
      // Stage 3 is completely overlapping.

      if (evaluator1_.isDynamic() || evaluator2_.isDynamic()) {
        common_             = seleMan1_ & seleMan2_;
        sele1_minus_common_ = seleMan1_ - common_;
        sele2_minus_common_ = seleMan2_ - common_;
        nSelected1_         = seleMan1_.getSelectionCount();
        nSelected2_         = seleMan2_.getSelectionCount();
        int nIntersect      = common_.getSelectionCount();

        nPairs_ = nSelected1_ * nSelected2_ - (nIntersect + 1) * nIntersect / 2;
      }

      processNonOverlapping(sele1_minus_common_, seleMan2_);
      processNonOverlapping(common_, sele2_minus_common_);
      processOverlapping(common_);

      processHistogram();
    }

    postProcess();

    writeRdf();
  }